

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall
TasGrid::GridGlobal::estimateAnisotropicCoefficients
          (GridGlobal *this,TypeDepth type,int output,vector<int,_std::allocator<int>_> *weights)

{
  vector<double,_std::allocator<double>_> surp;
  _Vector_base<double,_std::allocator<double>_> local_50;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  computeSurpluses((vector<double,_std::allocator<double>_> *)&local_50,this,output,false);
  MultiIndexManipulations::inferAnisotropicWeights
            ((vector<int,_std::allocator<int>_> *)&local_38,
             (this->super_BaseCanonicalGrid).acceleration,this->rule,type,
             &(this->super_BaseCanonicalGrid).points,
             (vector<double,_std::allocator<double>_> *)&local_50,1e-09);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign(weights,&local_38);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void GridGlobal::estimateAnisotropicCoefficients(TypeDepth type, int output, std::vector<int> &weights) const{
    double tol = 1000.0 * Maths::num_tol;
    std::vector<double> surp = computeSurpluses(output, false);

    weights = MultiIndexManipulations::inferAnisotropicWeights(acceleration, rule, type, points, surp, tol);
}